

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O3

int do_chown(int nargs,char **args)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  uint __group;
  int *piVar4;
  
  if (nargs == 4) {
    pcVar1 = args[3];
    uVar2 = decode_uid(args[1]);
    __group = decode_uid(args[2]);
    iVar3 = chown(pcVar1,uVar2,__group);
    if (iVar3 != 0) goto LAB_001050b0;
  }
  else {
    if (nargs != 3) {
      return -1;
    }
    pcVar1 = args[2];
    uVar2 = decode_uid(args[1]);
    iVar3 = chown(pcVar1,uVar2,0xffffffff);
    if (iVar3 < 0) {
LAB_001050b0:
      piVar4 = __errno_location();
      return -*piVar4;
    }
  }
  return 0;
}

Assistant:

int do_chown(int nargs, char **args) {
    /* GID is optional. */
    if (nargs == 3) {
        if (chown(args[2], decode_uid(args[1]), -1) < 0)
            return -errno;
    } else if (nargs == 4) {
        if (chown(args[3], decode_uid(args[1]), decode_uid(args[2])))
            return -errno;
    } else {
        return -1;
    }
    return 0;
}